

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O1

DdNode * Cudd_Dxygtdyz(DdManager *dd,int N,DdNode **x,DdNode **y,DdNode **z)

{
  int *piVar1;
  DdNode *g;
  bool bVar2;
  DdNode *g_00;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *n_00;
  DdNode *g_01;
  DdNode *g_02;
  long lVar4;
  long lVar5;
  
  g = dd->one;
  lVar4 = (long)N;
  g_00 = Cudd_bddIte(dd,y[lVar4 + -1],g,z[lVar4 + -1]);
  if (g_00 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    lVar4 = lVar4 + -1;
    n = Cudd_bddIte(dd,y[lVar4],z[lVar4],(DdNode *)((ulong)g ^ 1));
    if (n != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = Cudd_bddIte(dd,x[lVar4],g_00,(DdNode *)((ulong)n ^ 1));
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,g_00);
        Cudd_RecursiveDeref(dd,n);
        if (1 < N) {
          g_00 = pDVar3;
          lVar4 = (ulong)(N - 2) + 1;
          do {
            n = Cudd_bddIte(dd,z[lVar4 + -1],g_00,(DdNode *)((ulong)g ^ 1));
            if (n == (DdNode *)0x0) goto LAB_00788b93;
            piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            pDVar3 = Cudd_bddIte(dd,z[lVar4 + -1],g_00,g);
            if (pDVar3 == (DdNode *)0x0) goto LAB_00788ab2;
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            n_00 = Cudd_bddIte(dd,z[lVar4 + -1],g,g_00);
            if (n_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,n);
              g_00 = pDVar3;
              goto LAB_00788b93;
            }
            piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            g_01 = Cudd_bddIte(dd,z[lVar4 + -1],g,(DdNode *)((ulong)g_00 ^ 1));
            if (g_01 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_00);
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar3);
              g_00 = n_00;
              goto LAB_00788b93;
            }
            piVar1 = (int *)(((ulong)g_01 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g_00);
            g_02 = Cudd_bddIte(dd,y[lVar4 + -1],pDVar3,n);
            if (g_02 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,n_00);
              g_00 = g_01;
              goto LAB_00788b93;
            }
            piVar1 = (int *)(((ulong)g_02 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            g_00 = Cudd_bddIte(dd,y[lVar4 + -1],g_01,(DdNode *)((ulong)n_00 ^ 1));
            if (g_00 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,n_00);
              g_00 = g_01;
              n = g_02;
              goto LAB_00788ab2;
            }
            piVar1 = (int *)(((ulong)g_00 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar3);
            Cudd_RecursiveDeref(dd,n_00);
            Cudd_RecursiveDeref(dd,g_01);
            pDVar3 = Cudd_bddIte(dd,x[lVar4 + -1],g_02,(DdNode *)((ulong)g_00 ^ 1));
            if (pDVar3 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,g_02);
              goto LAB_00788b93;
            }
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,g_02);
            Cudd_RecursiveDeref(dd,g_00);
            lVar5 = lVar4 + -1;
            bVar2 = 0 < lVar4;
            g_00 = pDVar3;
            lVar4 = lVar5;
          } while (lVar5 != 0 && bVar2);
        }
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return (DdNode *)((ulong)pDVar3 ^ 1);
      }
LAB_00788ab2:
      Cudd_RecursiveDeref(dd,g_00);
      g_00 = n;
    }
LAB_00788b93:
    Cudd_RecursiveDeref(dd,g_00);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_Dxygtdyz(
  DdManager * dd /* DD manager */,
  int  N /* number of x, y, and z variables */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables */)
{
    DdNode *one, *zero;
    DdNode *z1, *z2, *z3, *z4, *y1_, *y2, *x1;
    int     i;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    /* Build bottom part of BDD outside loop. */
    y1_ = Cudd_bddIte(dd, y[N-1], one, z[N-1]);
    if (y1_ == NULL) return(NULL);
    cuddRef(y1_);
    y2 = Cudd_bddIte(dd, y[N-1], z[N-1], zero);
    if (y2 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        return(NULL);
    }
    cuddRef(y2);
    x1 = Cudd_bddIte(dd, x[N-1], y1_, Cudd_Not(y2));
    if (x1 == NULL) {
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
        return(NULL);
    }
    cuddRef(x1);
    Cudd_RecursiveDeref(dd, y1_);
    Cudd_RecursiveDeref(dd, y2);

    /* Loop to build the rest of the BDD. */
    for (i = N-2; i >= 0; i--) {
        z1 = Cudd_bddIte(dd, z[i], x1, zero);
        if (z1 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            return(NULL);
        }
        cuddRef(z1);
        z2 = Cudd_bddIte(dd, z[i], x1, one);
        if (z2 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            return(NULL);
        }
        cuddRef(z2);
        z3 = Cudd_bddIte(dd, z[i], one, x1);
        if (z3 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            return(NULL);
        }
        cuddRef(z3);
        z4 = Cudd_bddIte(dd, z[i], one, Cudd_Not(x1));
        if (z4 == NULL) {
            Cudd_RecursiveDeref(dd, x1);
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            return(NULL);
        }
        cuddRef(z4);
        Cudd_RecursiveDeref(dd, x1);
        y1_ = Cudd_bddIte(dd, y[i], z2, z1);
        if (y1_ == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            return(NULL);
        }
        cuddRef(y1_);
        y2 = Cudd_bddIte(dd, y[i], z4, Cudd_Not(z3));
        if (y2 == NULL) {
            Cudd_RecursiveDeref(dd, z1);
            Cudd_RecursiveDeref(dd, z2);
            Cudd_RecursiveDeref(dd, z3);
            Cudd_RecursiveDeref(dd, z4);
            Cudd_RecursiveDeref(dd, y1_);
            return(NULL);
        }
        cuddRef(y2);
        Cudd_RecursiveDeref(dd, z1);
        Cudd_RecursiveDeref(dd, z2);
        Cudd_RecursiveDeref(dd, z3);
        Cudd_RecursiveDeref(dd, z4);
        x1 = Cudd_bddIte(dd, x[i], y1_, Cudd_Not(y2));
        if (x1 == NULL) {
            Cudd_RecursiveDeref(dd, y1_);
            Cudd_RecursiveDeref(dd, y2);
            return(NULL);
        }
        cuddRef(x1);
        Cudd_RecursiveDeref(dd, y1_);
        Cudd_RecursiveDeref(dd, y2);
    }
    cuddDeref(x1);
    return(Cudd_Not(x1));

}